

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O0

void helics::valueExtract(data_view *data,DataType baseType,NamedPoint *val)

{
  double dVar1;
  complex<double> val_00;
  complex<double> val_01;
  string_view val_02;
  ulong count;
  reference pvVar2;
  size_type sVar3;
  long in_RDX;
  uint in_ESI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> cvec;
  complex<double> cval;
  data_view *in_stack_00000138;
  vector<double,_std::allocator<double>_> vec;
  Time time;
  long value_1;
  double value;
  NamedPoint *in_stack_fffffffffffffe38;
  NamedPoint *in_stack_fffffffffffffe40;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe50;
  data_view *in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> local_108;
  undefined8 local_f0;
  undefined8 local_e8;
  size_t in_stack_ffffffffffffff20;
  NamedPoint *in_stack_ffffffffffffff28;
  defV *in_stack_ffffffffffffff30;
  complex<double> local_c0 [4];
  vector<double,_std::allocator<double>_> local_80;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  long local_28;
  double local_20;
  long local_18;
  
  count = (ulong)in_ESI;
  local_18 = in_RDX;
  switch(count) {
  case 0:
  case 9:
  default:
    local_68 = ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::interpret
                         ((data_view *)in_stack_fffffffffffffe40);
    val_02._M_str = (char *)in_stack_ffffffffffffff28;
    val_02._M_len = in_stack_ffffffffffffff20;
    helicsGetNamedPoint(val_02);
    NamedPoint::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    NamedPoint::~NamedPoint((NamedPoint *)0x4280c6);
    break;
  case 1:
    local_20 = ValueConverter<double>::interpret((data_view *)in_stack_fffffffffffffe40);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    *(double *)(local_18 + 0x20) = local_20;
    break;
  case 2:
    local_28 = ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe40);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    *(double *)(local_18 + 0x20) = (double)local_28;
    break;
  case 3:
    ValueConverter<std::complex<double>_>::interpret((data_view *)in_stack_fffffffffffffe40);
    local_c0[0]._M_value._4_4_ = extraout_XMM0_Db;
    local_c0[0]._M_value._0_4_ = extraout_XMM0_Da;
    local_c0[0]._M_value._8_8_ = in_XMM1_Qa;
    dVar1 = std::complex<double>::imag_abi_cxx11_(local_c0);
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      local_f0 = local_c0[0]._M_value._0_8_;
      local_e8 = local_c0[0]._M_value._8_8_;
      val_00._M_value._8_8_ = in_stack_fffffffffffffe58;
      val_00._M_value._0_8_ = in_stack_fffffffffffffe50;
      helicsComplexString_abi_cxx11_(val_00);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40);
      dVar1 = nan("0");
      *(double *)(local_18 + 0x20) = dVar1;
    }
    else {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      dVar1 = std::complex<double>::real_abi_cxx11_(local_c0);
      *(double *)(local_18 + 0x20) = dVar1;
    }
    break;
  case 4:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              (in_stack_fffffffffffffe58);
    sVar3 = std::vector<double,_std::allocator<double>_>::size(&local_80);
    if (sVar3 == 1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](&local_80,0);
      *(value_type *)(local_18 + 0x20) = *pvVar2;
    }
    else {
      helicsVectorString_abi_cxx11_
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40);
      dVar1 = nan("0");
      *(double *)(local_18 + 0x20) = dVar1;
    }
    std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffffe50);
    break;
  case 5:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret(in_stack_fffffffffffffe58);
    sVar3 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                      (&local_108);
    if (sVar3 == 1) {
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::operator[]
                (&local_108,0);
      val_01._M_value._8_8_ = in_stack_fffffffffffffe58;
      val_01._M_value._0_8_ = in_stack_fffffffffffffe50;
      helicsComplexString_abi_cxx11_(val_01);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40);
      dVar1 = nan("0");
      *(double *)(local_18 + 0x20) = dVar1;
    }
    else {
      helicsComplexVectorString_abi_cxx11_
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffe90);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe40);
      dVar1 = nan("0");
      *(double *)(local_18 + 0x20) = dVar1;
    }
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::~vector
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffe50);
    break;
  case 6:
    ValueConverter<helics::NamedPoint>::interpret(in_stack_fffffffffffffe58);
    NamedPoint::operator=(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    NamedPoint::~NamedPoint((NamedPoint *)0x4283f2);
    break;
  case 8:
    ValueConverter<long>::interpret((data_view *)in_stack_fffffffffffffe40);
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffffe50,count,
               (time_units)((ulong)in_stack_fffffffffffffe40 >> 0x20));
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
    dVar1 = TimeRepresentation::operator_cast_to_double
                      ((TimeRepresentation<count_time<9,_long>_> *)0x428056);
    *(double *)(local_18 + 0x20) = dVar1;
    break;
  case 0x1e:
    readJsonValue_abi_cxx11_(in_stack_00000138);
    valueExtract(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::
    variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                *)0x428429);
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, NamedPoint& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val.name = "value";
            val.value = value;
            break;
        }
        case DataType::HELICS_INT: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val.name = "value";
            val.value = static_cast<double>(value);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val.name = "time";
            val.value = static_cast<double>(time);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetNamedPoint(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val.name = "value";

                val.value = vec[0];
            } else {
                val.name = helicsVectorString(vec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_COMPLEX: {
            auto cval = ValueConverter<std::complex<double>>::interpret(data);
            if (cval.imag() == 0) {
                val.name = "value";
                val.value = cval.real();
            } else {
                val.name = helicsComplexString(cval);
                val.value = std::nan("0");
            }

            break;
        }
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (cvec.size() == 1) {
                val.name = helicsComplexString(cvec[0]);
                val.value = std::nan("0");
            } else {
                val.name = helicsComplexVectorString(cvec);
                val.value = std::nan("0");
            }
            break;
        }
        case DataType::HELICS_NAMED_POINT:
            val = ValueConverter<NamedPoint>::interpret(data);
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}